

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
dlib::
add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>
::add_layer(add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_void>
            *this)

{
  add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>
  *this_00;
  undefined1 auVar1 [16];
  undefined1 auVar2 [32];
  storage_heap sVar3;
  
  auVar1 = ZEXT816(0) << 0x40;
  auVar2 = ZEXT1632(auVar1);
  (this->details).params.super_tensor.m_n = auVar2._0_8_;
  (this->details).params.super_tensor.m_k = auVar2._8_8_;
  (this->details).params.super_tensor.m_nr = auVar2._16_8_;
  (this->details).params.super_tensor.m_nc = auVar2._24_8_;
  (this->details).params.super_tensor.m_size = 0;
  (this->details).params.data_instance.data_size = 0;
  (this->details).params.super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->details).params.data_instance.host_current = true;
  (this->details).params.data_instance.device_current = true;
  (this->details).params.data_instance.have_active_transfer = false;
  (this->details).params.data_instance.device_in_use = false;
  (this->details).params.data_instance.data_host = (shared_ptr<float>)auVar2._0_16_;
  (this->details).params.data_instance.data_device = (shared_ptr<float>)auVar2._16_16_;
  *(undefined1 (*) [32])
   ((long)&(this->details).params.data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = ZEXT1632(auVar1);
  (this->details).params._annotation.storage = (storage_heap)ZEXT1632(auVar1);
  (this->details).disabled = false;
  this_00 = (add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>
             *)operator_new(0x630);
  add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>
  ::add_layer(this_00);
  (this->subnetwork)._M_t.
  super___uniq_ptr_impl<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>,_std::default_delete<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_std::default_delete<dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_>_>
  .
  super__Head_base<0UL,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_3L,_3L,_1,_1,_1,_1>,_dlib::add_layer<dlib::relu_,_dlib::add_layer<dlib::bn_<(dlib::layer_mode)0>,_dlib::add_layer<dlib::con_<512L,_1L,_1L,_1,_1,_0,_0>,_dlib::add_tag_layer<1UL,_dlib::impl::repeat_input_layer,_void>,_void>,_void>,_void>,_void>,_void>_*,_false>
  ._M_head_impl = this_00;
  this->this_layer_setup_called = false;
  this->gradient_input_is_stale = true;
  this->get_output_and_gradient_input_disabled = false;
  auVar1 = ZEXT816(0) << 0x40;
  auVar2 = ZEXT1632(auVar1);
  (this->x_grad).super_tensor.m_n = auVar2._0_8_;
  (this->x_grad).super_tensor.m_k = auVar2._8_8_;
  (this->x_grad).super_tensor.m_nr = auVar2._16_8_;
  (this->x_grad).super_tensor.m_nc = auVar2._24_8_;
  (this->x_grad).super_tensor.m_size = 0;
  (this->x_grad).data_instance.data_size = 0;
  (this->x_grad).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->x_grad).data_instance.host_current = true;
  (this->x_grad).data_instance.device_current = true;
  (this->x_grad).data_instance.have_active_transfer = false;
  (this->x_grad).data_instance.device_in_use = false;
  (this->x_grad).data_instance.data_host = (shared_ptr<float>)auVar2._0_16_;
  (this->x_grad).data_instance.data_device = (shared_ptr<float>)auVar2._16_16_;
  sVar3 = (storage_heap)ZEXT1632(auVar1);
  *(storage_heap *)
   ((long)&(this->x_grad).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->x_grad)._annotation.storage = sVar3;
  (this->cached_output).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->cached_output).super_tensor.m_k = (longlong)sVar3.del;
  (this->cached_output).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->cached_output).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->cached_output).super_tensor.m_size = 0;
  (this->cached_output).data_instance.data_size = 0;
  (this->cached_output).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->cached_output).data_instance.host_current = true;
  (this->cached_output).data_instance.device_current = true;
  (this->cached_output).data_instance.have_active_transfer = false;
  (this->cached_output).data_instance.device_in_use = false;
  (this->cached_output).data_instance.data_host.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.ptr;
  (this->cached_output).data_instance.data_host.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->cached_output).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->cached_output).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  sVar3 = (storage_heap)ZEXT1632(auVar1);
  *(storage_heap *)
   ((long)&(this->cached_output).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->cached_output)._annotation.storage = sVar3;
  (this->params_grad).super_tensor.m_size = 0;
  (this->params_grad).data_instance.data_size = 0;
  (this->params_grad).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->params_grad).super_tensor.m_k = (longlong)sVar3.del;
  (this->params_grad).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->params_grad).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->params_grad).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->params_grad).data_instance.host_current = true;
  (this->params_grad).data_instance.device_current = true;
  (this->params_grad).data_instance.have_active_transfer = false;
  (this->params_grad).data_instance.device_in_use = false;
  (this->params_grad).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)sVar3.ptr;
  (this->params_grad).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->params_grad).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->params_grad).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  *(storage_heap *)
   ((long)&(this->params_grad).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = sVar3;
  (this->params_grad)._annotation.storage = sVar3;
  (this->temp_tensor).super_tensor.m_n = (longlong)sVar3.ptr;
  (this->temp_tensor).super_tensor.m_k = (longlong)sVar3.del;
  (this->temp_tensor).super_tensor.m_nr = (longlong)sVar3.copy;
  (this->temp_tensor).super_tensor.m_nc = (longlong)sVar3.type_id_;
  (this->temp_tensor).super_tensor.m_size = 0;
  (this->temp_tensor).data_instance.data_size = 0;
  (this->temp_tensor).super_tensor._vptr_tensor = (_func_int **)&PTR__resizable_tensor_001fb0e8;
  (this->temp_tensor).data_instance.host_current = true;
  (this->temp_tensor).data_instance.device_current = true;
  (this->temp_tensor).data_instance.have_active_transfer = false;
  (this->temp_tensor).data_instance.device_in_use = false;
  (this->temp_tensor).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (element_type *)sVar3.ptr;
  (this->temp_tensor).data_instance.data_host.super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount = (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.del;
  (this->temp_tensor).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)sVar3.copy;
  (this->temp_tensor).data_instance.data_device.
  super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_refcount =
       (__shared_count<(__gnu_cxx::_Lock_policy)2>)sVar3.type_id_;
  *(undefined1 (*) [32])
   ((long)&(this->temp_tensor).data_instance.data_device.
           super___shared_ptr<float,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4) = ZEXT1632(auVar1);
  (this->temp_tensor)._annotation.storage = (storage_heap)ZEXT1632(auVar1);
  this_00->get_output_and_gradient_input_disabled = true;
  return;
}

Assistant:

add_layer(
        ):
            subnetwork(new subnet_type()),
            this_layer_setup_called(false),
            gradient_input_is_stale(true),
            get_output_and_gradient_input_disabled(false)
        {
            if (this_layer_operates_inplace())
                subnetwork->disable_output_and_gradient_getters();
        }